

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O2

int lws_tls_check_all_cert_lifetimes(lws_context *context)

{
  lws_vhost *v;
  int iVar1;
  lws_vhost **pplVar2;
  
  pplVar2 = &context->vhost_list;
  do {
    v = *pplVar2;
    if (v == (lws_vhost *)0x0) {
      return 0;
    }
    iVar1 = lws_tls_check_cert_lifetime(v);
    pplVar2 = &v->vhost_next;
  } while (-1 < iVar1);
  return -1;
}

Assistant:

int
lws_tls_check_all_cert_lifetimes(struct lws_context *context)
{
	struct lws_vhost *v = context->vhost_list;

	while (v) {
		if (lws_tls_check_cert_lifetime(v) < 0)
			return -1;
		v = v->vhost_next;
	}

	return 0;
}